

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

Block * __thiscall
google::protobuf::Arena::NewBlock
          (Arena *this,void *me,Block *my_last_block,size_t n,size_t start_block_size,
          size_t max_block_size)

{
  unsigned_long uVar1;
  LogMessage *other;
  unsigned_long *puVar2;
  Block *pBVar3;
  Block *b;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  ulong local_40;
  size_t size;
  size_t max_block_size_local;
  size_t start_block_size_local;
  size_t n_local;
  Block *my_last_block_local;
  void *me_local;
  Arena *this_local;
  
  local_40 = start_block_size;
  if ((my_last_block != (Block *)0x0) &&
     (local_40 = my_last_block->size << 1, max_block_size < local_40)) {
    local_40 = max_block_size;
  }
  size = max_block_size;
  max_block_size_local = start_block_size;
  start_block_size_local = n;
  n_local = (size_t)my_last_block;
  my_last_block_local = (Block *)me;
  me_local = this;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  local_79 = 0;
  if (uVar1 - 0x20 < n) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x85);
    local_79 = 1;
    other = internal::LogMessage::operator<<
                      (&local_78,
                       "CHECK failed: (n) <= (std::numeric_limits<size_t>::max() - kHeaderSize): ");
    internal::LogFinisher::operator=(local_8d,other);
  }
  if ((local_79 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_78);
  }
  b = (Block *)(start_block_size_local + 0x20);
  puVar2 = std::max<unsigned_long>(&local_40,(unsigned_long *)&b);
  local_40 = *puVar2;
  pBVar3 = (Block *)(**(code **)(this + 0x60))(local_40);
  pBVar3->pos = start_block_size_local + 0x20;
  pBVar3->size = local_40;
  pBVar3->owner = my_last_block_local;
  return pBVar3;
}

Assistant:

Arena::Block* Arena::NewBlock(void* me, Block* my_last_block, size_t n,
                              size_t start_block_size, size_t max_block_size) {
  size_t size;
  if (my_last_block != NULL) {
    // Double the current block size, up to a limit.
    size = 2 * (my_last_block->size);
    if (size > max_block_size) size = max_block_size;
  } else {
    size = start_block_size;
  }
  // Verify that n + kHeaderSize won't overflow.
  GOOGLE_CHECK_LE(n, std::numeric_limits<size_t>::max() - kHeaderSize);
  size = std::max(size, kHeaderSize + n);

  Block* b = reinterpret_cast<Block*>(options_.block_alloc(size));
  b->pos = kHeaderSize + n;
  b->size = size;
  b->owner = me;
#ifdef ADDRESS_SANITIZER
  // Poison the rest of the block for ASAN. It was unpoisoned by the underlying
  // malloc but it's not yet usable until we return it as part of an allocation.
  ASAN_POISON_MEMORY_REGION(
      reinterpret_cast<char*>(b) + b->pos, b->size - b->pos);
#endif  // ADDRESS_SANITIZER
  return b;
}